

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  bufq *q;
  void *pvVar1;
  curl_trc_feat *pcVar2;
  ssl_connect_data *connssl;
  undefined8 *puVar3;
  ossl_ctx *octx;
  _Bool _Var4;
  CURLcode CVar5;
  uint uVar6;
  CURLcode CVar7;
  int iVar8;
  uint err;
  ssl_config_data *psVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  SSL_CIPHER *c;
  BIO_METHOD *type;
  BIO *pBVar13;
  ulong uVar14;
  int *piVar15;
  uchar **buf_00;
  char *pcVar16;
  void *pvVar17;
  size_t blen;
  size_t nwritten;
  char *local_190;
  uchar *buf;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uchar *neg_protocol;
  uchar auStack_130 [256];
  
  pvVar1 = cf->ctx;
  if (*(int *)((long)pvVar1 + 0xb8) == 3) {
    CVar5 = CURLE_OK;
    _Var4 = true;
    goto LAB_00170152;
  }
  *done = false;
  *(undefined4 *)((long)pvVar1 + 0xc4) = 0;
  iVar8 = *(int *)((long)pvVar1 + 0xbc);
  if (iVar8 == 0) {
    pvVar17 = pvVar1;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, step1");
      pvVar17 = cf->ctx;
    }
    octx = *(ossl_ctx **)((long)pvVar17 + 0x40);
    CVar7 = Curl_ossl_ctx_init(octx,cf,data,(ssl_peer *)((long)pvVar17 + 8),
                               *(alpn_spec **)((long)pvVar17 + 0x38),(Curl_ossl_ctx_setup_cb *)0x0,
                               (void *)0x0,ossl_new_session_cb,cf,ossl_on_session_reuse);
    if (CVar7 == CURLE_OK) {
      type = (BIO_METHOD *)BIO_meth_new(0x401,"OpenSSL CF BIO");
      if (type == (BIO_METHOD *)0x0) {
        octx->bio_method = (BIO_METHOD *)0x0;
      }
      else {
        BIO_meth_set_write(type,ossl_bio_cf_out_write);
        BIO_meth_set_read(type,ossl_bio_cf_in_read);
        BIO_meth_set_ctrl(type,ossl_bio_cf_ctrl);
        BIO_meth_set_create(type,ossl_bio_cf_create);
        BIO_meth_set_destroy(type,ossl_bio_cf_destroy);
        octx->bio_method = (BIO_METHOD *)type;
        pBVar13 = BIO_new(type);
        if (pBVar13 != (BIO *)0x0) {
          BIO_set_data(pBVar13,cf);
          BIO_up_ref(pBVar13);
          SSL_set0_rbio(octx->ssl,pBVar13);
          SSL_set0_wbio(octx->ssl,pBVar13);
          if ((*(alpn_spec **)((long)pvVar17 + 0x38) != (alpn_spec *)0x0) &&
             (*(int *)((long)pvVar17 + 0xb8) != 1)) {
            auStack_130[8] = '\0';
            auStack_130[9] = '\0';
            auStack_130[10] = '\0';
            auStack_130[0xb] = '\0';
            auStack_130[0xc] = '\0';
            auStack_130[0xd] = '\0';
            auStack_130[0xe] = '\0';
            auStack_130[0xf] = '\0';
            auStack_130[0x10] = '\0';
            auStack_130[0x11] = '\0';
            auStack_130[0x12] = '\0';
            auStack_130[0x13] = '\0';
            auStack_130[0x14] = '\0';
            auStack_130[0x15] = '\0';
            auStack_130[0x16] = '\0';
            auStack_130[0x17] = '\0';
            neg_protocol = (uchar *)0x0;
            auStack_130[0] = '\0';
            auStack_130[1] = '\0';
            auStack_130[2] = '\0';
            auStack_130[3] = '\0';
            auStack_130[4] = '\0';
            auStack_130[5] = '\0';
            auStack_130[6] = '\0';
            auStack_130[7] = '\0';
            auStack_130._24_8_ = 0;
            Curl_alpn_to_proto_str
                      ((alpn_proto_buf *)&neg_protocol,*(alpn_spec **)((long)pvVar17 + 0x38));
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              Curl_infof(data,"ALPN: curl offers %s",&neg_protocol);
            }
          }
          *(undefined4 *)((long)pvVar17 + 0xbc) = 1;
          iVar8 = *(int *)((long)pvVar1 + 0xbc);
          goto LAB_0016fb1c;
        }
      }
      CVar7 = CURLE_OUT_OF_MEMORY;
      goto LAB_00170140;
    }
LAB_0016ff5f:
    _Var4 = false;
    CVar5 = CURLE_OK;
    if (CVar7 == CURLE_AGAIN) goto LAB_00170152;
    goto LAB_00170140;
  }
LAB_0016fb1c:
  if (iVar8 == 1) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, step2");
    }
    if (*(int *)((long)pvVar1 + 0xc0) == 1) goto LAB_0017013e;
    if (*(int *)((long)pvVar1 + 0xc0) == 2) {
      pvVar17 = cf->ctx;
      lVar10 = *(long *)((long)pvVar17 + 0x40);
      *(undefined4 *)(lVar10 + 0x20) = 0;
      q = (bufq *)((long)pvVar17 + 0x68);
      _Var4 = Curl_bufq_peek(q,&buf,&blen);
      if (_Var4) {
LAB_0016fbbd:
        nwritten = 0;
        uVar6 = SSL_write_early_data
                          (*(undefined8 *)(lVar10 + 8),buf,CONCAT44(blen._4_4_,(uint)blen));
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ) && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"SSL_write_early_data(len=%zu) -> %d, %zu",
                            CONCAT44(blen._4_4_,(uint)blen),(ulong)uVar6,nwritten);
        }
        if (0 < (int)uVar6) goto code_r0x0016fc31;
        iVar8 = SSL_get_error(*(SSL **)(lVar10 + 8),uVar6);
        switch(iVar8) {
        case 0:
          pcVar11 = "SSL_ERROR_NONE";
          break;
        case 1:
          uVar14 = ERR_get_error();
          pcVar11 = ossl_strerror(uVar14,(char *)&neg_protocol,0x100);
          Curl_failf(data,"SSL_write_early_data() error: %s",pcVar11);
          goto LAB_001705a2;
        case 2:
          *(undefined4 *)((long)pvVar17 + 0xc4) = 1;
          goto LAB_001704d6;
        case 3:
          *(undefined4 *)((long)pvVar17 + 0xc4) = 2;
LAB_001704d6:
          CVar7 = CURLE_AGAIN;
          goto LAB_0016ff5f;
        case 4:
          pcVar11 = "SSL_ERROR_WANT_X509_LOOKUP";
          break;
        case 5:
          piVar15 = __errno_location();
          CVar7 = CURLE_AGAIN;
          if (*(int *)(lVar10 + 0x20) != 0x51) {
            iVar8 = *piVar15;
            uVar14 = ERR_get_error();
            if (uVar14 == 0) {
              if (iVar8 == 0) {
                curl_msnprintf((char *)&neg_protocol,0x100,"%s","SSL_ERROR_SYSCALL");
              }
              else {
                Curl_strerror(iVar8,(char *)&neg_protocol,0x100);
              }
            }
            else {
              ossl_strerror(uVar14,(char *)&neg_protocol,0x100);
            }
            Curl_failf(data,"OpenSSL SSL_write:early_data: %s, errno %d",&neg_protocol);
            CVar7 = CURLE_SEND_ERROR;
          }
          goto LAB_0016ff5f;
        case 6:
          pcVar11 = "SSL_ERROR_ZERO_RETURN";
          break;
        case 7:
          pcVar11 = "SSL_ERROR_WANT_CONNECT";
          break;
        case 8:
          pcVar11 = "SSL_ERROR_WANT_ACCEPT";
          break;
        case 9:
          pcVar11 = "SSL_ERROR_WANT_ASYNC";
          break;
        case 10:
          pcVar11 = "SSL_ERROR_WANT_ASYNC_JOB";
          break;
        default:
          pcVar11 = "SSL_ERROR unknown";
        }
        __errno_location();
        Curl_failf(data,"OpenSSL SSL_write_early_data: %s, errno %d",pcVar11);
LAB_001705a2:
        CVar7 = CURLE_SEND_ERROR;
        goto LAB_0016ff5f;
      }
LAB_0016fc58:
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"SSL sending %zu bytes of early data",*(undefined8 *)((long)pvVar17 + 0xb0))
        ;
      }
      *(undefined4 *)((long)pvVar1 + 0xc0) = 3;
    }
    connssl = (ssl_connect_data *)cf->ctx;
    puVar3 = (undefined8 *)connssl->backend;
    psVar9 = Curl_ssl_cf_get_config(cf,data);
    connssl->io_need = 0;
    ERR_clear_error();
    uVar6 = SSL_connect((SSL *)puVar3[1]);
    if ((*(byte *)((long)puVar3 + 0x24) & 1) == 0) {
      CVar7 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar3);
      if (CVar7 != CURLE_OK) goto LAB_0016ff5f;
      *(byte *)((long)puVar3 + 0x24) = *(byte *)((long)puVar3 + 0x24) | 1;
    }
    if (uVar6 == 1) {
      buf = (uchar *)((ulong)buf._4_4_ << 0x20);
      connssl->connecting_state = ssl_connect_3;
      SSL_get_peer_signature_type_nid(puVar3[1]);
      lVar10 = SSL_ctrl((SSL *)puVar3[1],0x86,0,(void *)0x0);
      pcVar11 = OBJ_nid2sn((uint)lVar10 & 0xffff);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        pcVar12 = SSL_get_version((SSL *)puVar3[1]);
        c = SSL_get_current_cipher((SSL *)puVar3[1]);
        local_190 = SSL_CIPHER_get_name(c);
        pcVar16 = "[blank]";
        if (pcVar11 != (char *)0x0) {
          pcVar16 = pcVar11;
        }
        pcVar11 = OBJ_nid2sn((int)buf);
        Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar12,local_190,pcVar16,pcVar11);
      }
      if (connssl->alpn != (alpn_spec *)0x0) {
        SSL_get0_alpn_selected(puVar3[1],&neg_protocol,&blen);
        CVar7 = Curl_alpn_set_negotiated(cf,data,connssl,neg_protocol,(ulong)(uint)blen);
        if (CVar7 != CURLE_OK) goto LAB_0016ff5f;
      }
      goto LAB_0016fe3d;
    }
    err = SSL_get_error((SSL *)puVar3[1],uVar6);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"SSL_connect() -> err=%d, detail=%d",(ulong)uVar6,(ulong)err);
    }
    if (8 < (int)err) {
      if (err == 9) {
        iVar8 = 1;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ) && (0 < cf->cft->log_level)))) {
          pcVar11 = "SSL_connect() -> want async";
          iVar8 = 1;
          goto LAB_001703d3;
        }
      }
      else {
        if (err != 0xc) goto LAB_001702c2;
        iVar8 = 1;
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) && (0 < cf->cft->log_level)) {
          pcVar11 = "SSL_connect() -> want retry_verify";
          iVar8 = 1;
          goto LAB_001703d3;
        }
      }
LAB_001703dd:
      connssl->io_need = iVar8;
      _Var4 = false;
      CVar5 = CURLE_OK;
      goto LAB_00170152;
    }
    if (err == 2) {
      iVar8 = 1;
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        pcVar11 = "SSL_connect() -> want recv";
        iVar8 = 1;
LAB_001703d3:
        Curl_trc_cf_infof(data,cf,pcVar11);
      }
      goto LAB_001703dd;
    }
    if (err == 3) {
      iVar8 = 2;
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        pcVar11 = "SSL_connect() -> want send";
        iVar8 = 2;
        goto LAB_001703d3;
      }
      goto LAB_001703dd;
    }
LAB_001702c2:
    memset(&neg_protocol,0,0x100);
    connssl->connecting_state = ssl_connect_2;
    uVar14 = ERR_get_error();
    uVar6 = (uint)uVar14;
    if ((uVar6 & 0xff800000) == 0xa000000 && -1 < (int)uVar6) {
      uVar6 = uVar6 & 0x7fffff;
      if (uVar6 != 0x86) {
        if (uVar6 == 0x45c) {
          pcVar11 = ossl_strerror(uVar14,(char *)&neg_protocol,0x100);
          Curl_failf(data,"TLS cert problem: %s",pcVar11);
          CVar7 = CURLE_SSL_CLIENTCERT;
          goto LAB_00170140;
        }
        if (uVar6 != 0x415) goto LAB_001703ec;
      }
      lVar10 = SSL_get_verify_result((SSL *)puVar3[1]);
      if (lVar10 == 0) {
        pcVar16 = "%s";
        pcVar11 = "SSL certificate verification failed";
      }
      else {
        psVar9->certverifyresult = lVar10;
        pcVar11 = X509_verify_cert_error_string(lVar10);
        pcVar16 = "SSL certificate problem: %s";
      }
      Curl_failf(data,pcVar16,pcVar11);
      CVar7 = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
LAB_001703ec:
      pcVar11 = ossl_strerror(uVar14,(char *)&neg_protocol,0x100);
      Curl_failf(data,"TLS connect error: %s",pcVar11);
      CVar7 = CURLE_SSL_CONNECT_ERROR;
      if (uVar14 == 0) {
        local_148 = 0;
        uStack_140 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_178 = 0;
        uStack_170 = 0;
        buf = (uchar *)0x0;
        uStack_180 = 0;
        piVar15 = __errno_location();
        if ((*piVar15 == 0) || (err != 5)) {
LAB_00170470:
          buf_00 = (uchar **)SSL_ERROR_to_str(err);
        }
        else {
          buf_00 = &buf;
          Curl_strerror(*piVar15,(char *)buf_00,0x50);
          if ((char)buf == '\0') goto LAB_00170470;
        }
        Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",buf_00,
                   (connssl->peer).hostname,(ulong)(uint)(connssl->peer).port);
      }
    }
  }
  else {
LAB_0016fe3d:
    iVar8 = *(int *)((long)pvVar1 + 0xbc);
    if (iVar8 == 2) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"ossl_connect, step3");
      }
      pvVar17 = cf->ctx;
      CVar7 = Curl_oss_check_peer_cert
                        (cf,data,*(ossl_ctx **)((long)pvVar17 + 0x40),
                         (ssl_peer *)((long)pvVar17 + 8));
      if (CVar7 != CURLE_OK) {
        Curl_ssl_scache_remove_all(cf,data,*(char **)((long)pvVar17 + 0x20));
        goto LAB_0016ff5f;
      }
      *(undefined4 *)((long)pvVar1 + 0xbc) = 3;
      if (*(int *)((long)pvVar1 + 0xc0) != 0) {
        iVar8 = SSL_get_early_data_status(*(undefined8 *)(*(long *)((long)pvVar1 + 0x40) + 8));
        *(uint *)((long)pvVar1 + 0xc0) = iVar8 == 2 ^ 5;
        iVar8 = *(int *)((long)pvVar1 + 0xbc);
        goto LAB_001700f0;
      }
    }
    else {
LAB_001700f0:
      if (iVar8 != 3) goto LAB_0017013e;
    }
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, done");
    }
    *(undefined4 *)((long)pvVar1 + 0xb8) = 3;
LAB_0017013e:
    CVar7 = CURLE_OK;
  }
LAB_00170140:
  CVar5 = CVar7;
  _Var4 = (*(uint *)((long)pvVar1 + 0xb8) & 0xfffffffd) == 1;
LAB_00170152:
  *done = _Var4;
  return CVar5;
code_r0x0016fc31:
  Curl_bufq_skip(q,nwritten);
  _Var4 = Curl_bufq_peek(q,&buf,&blen);
  if (!_Var4) goto LAB_0016fc58;
  goto LAB_0016fbbd;
}

Assistant:

static CURLcode ossl_connect(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  connssl->io_need = CURL_SSL_IO_NEED_NONE;

  if(ssl_connect_1 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step1");
    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_2 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step2");
#ifdef HAVE_OPENSSL_EARLYDATA
    if(connssl->earlydata_state == ssl_earlydata_await) {
      goto out;
    }
    else if(connssl->earlydata_state == ssl_earlydata_sending) {
      result = ossl_send_earlydata(cf, data);
      if(result)
        goto out;
      connssl->earlydata_state = ssl_earlydata_sent;
    }
#endif
    DEBUGASSERT((connssl->earlydata_state == ssl_earlydata_none) ||
                (connssl->earlydata_state == ssl_earlydata_sent));

    result = ossl_connect_step2(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_3 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step3");
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
    connssl->connecting_state = ssl_connect_done;
#ifdef HAVE_OPENSSL_EARLYDATA
    if(connssl->earlydata_state > ssl_earlydata_none) {
      struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
      /* We should be in this state by now */
      DEBUGASSERT(connssl->earlydata_state == ssl_earlydata_sent);
      connssl->earlydata_state =
        (SSL_get_early_data_status(octx->ssl) == SSL_EARLY_DATA_ACCEPTED) ?
        ssl_earlydata_accepted : ssl_earlydata_rejected;
    }
#endif
  }

  if(ssl_connect_done == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, done");
    connssl->state = ssl_connection_complete;
  }

out:
  if(result == CURLE_AGAIN) {
    *done = FALSE;
    return CURLE_OK;
  }
  *done = ((connssl->state == ssl_connection_complete) ||
           (connssl->state == ssl_connection_deferred));
  return result;
}